

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

bool __thiscall soul::Value::PackedData::StructIterator::next(StructIterator *this)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar1 = this->index;
  uVar2 = this->numMembers;
  if (uVar1 < uVar2) {
    this->member = this->member + this->memberSize;
    this->index = uVar1 + 1;
    if ((this->structure->members).numActive <= uVar1) {
      throwInternalCompilerError("index < numActive","operator[]",0x9f);
    }
    uVar3 = Type::getPackedSizeInBytes(&(this->structure->members).items[uVar1].type);
    this->memberSize = uVar3;
  }
  return uVar1 < uVar2;
}

Assistant:

bool next()
        {
            if (index >= numMembers)
                return false;

            member += memberSize;
            memberSize = (size_t) structure.getMemberType (index++).getPackedSizeInBytes();
            return true;
        }